

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Input * __thiscall helics::ValueFederate::getInput(ValueFederate *this,string_view name,int index1)

{
  pointer __lhs;
  Input *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  ValueFederateManager *in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  
  __lhs = std::
          unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
          ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                        *)0x2cebf7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff60,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58,
             (allocator<char> *)in_stack_ffffffffffffff50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffff6c);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  this_00 = ValueFederateManager::getInput(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  return this_00;
}

Assistant:

const Input& ValueFederate::getInput(std::string_view name, int index1) const
{
    return vfManager->getInput(std::string(name) + '_' + std::to_string(index1));
}